

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<char*>(string *__return_storage_ptr__,char *value)

{
  stringstream local_1a0 [8];
  stringstream s;
  ostream local_190 [376];
  char *local_18;
  char *value_local;
  
  local_18 = value;
  value_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (T value)
{
    std::stringstream s;
    s << value;
    return s.str ();
}